

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

void __thiscall
argo::parser::parse_name_value_pair
          (parser *this,lexer *l,unique_ptr<argo::json,_std::default_delete<argo::json>_> *object,
          size_t nesting_depth)

{
  token_type tVar1;
  token *this_00;
  string *psVar2;
  type pbVar3;
  json_parser_exception *pjVar4;
  size_t sVar5;
  pointer this_01;
  json_object *this_02;
  mapped_type *this_03;
  undefined1 local_78 [16];
  token *t2;
  string local_50 [8];
  string name;
  token *t1;
  size_t nesting_depth_local;
  unique_ptr<argo::json,_std::default_delete<argo::json>_> *object_local;
  lexer *l_local;
  parser *this_local;
  
  this_00 = lexer::next(l);
  std::__cxx11::string::string(local_50);
  tVar1 = token::get_type(this_00);
  if (tVar1 != string_e) {
    pjVar4 = (json_parser_exception *)__cxa_allocate_exception(0xe0);
    psVar2 = token::get_raw_value_abi_cxx11_(this_00);
    sVar5 = reader::get_byte_index(this->m_reader);
    json_parser_exception::json_parser_exception(pjVar4,unexpected_token_e,psVar2,sVar5);
    __cxa_throw(pjVar4,&json_parser_exception::typeinfo,
                json_parser_exception::~json_parser_exception);
  }
  if ((this->m_convert_strings & 1U) == 0) {
    psVar2 = token::get_raw_value_abi_cxx11_(this_00);
    std::__cxx11::string::operator=(local_50,(string *)psVar2);
  }
  else {
    psVar2 = token::get_raw_value_abi_cxx11_(this_00);
    utf8::json_string_to_utf8((utf8 *)&t2,psVar2);
    pbVar3 = std::
             unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator*((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&t2);
    std::__cxx11::string::operator=(local_50,(string *)pbVar3);
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&t2);
  }
  local_78._8_8_ = lexer::next(l);
  tVar1 = token::get_type((token *)local_78._8_8_);
  if (tVar1 != name_separator_e) {
    pjVar4 = (json_parser_exception *)__cxa_allocate_exception(0xe0);
    psVar2 = token::get_raw_value_abi_cxx11_((token *)local_78._8_8_);
    sVar5 = reader::get_byte_index(this->m_reader);
    json_parser_exception::json_parser_exception(pjVar4,unexpected_token_e,psVar2,sVar5);
    __cxa_throw(pjVar4,&json_parser_exception::typeinfo,
                json_parser_exception::~json_parser_exception);
  }
  parse_value((parser *)local_78,(lexer *)this,(size_t)l);
  this_01 = std::unique_ptr<argo::json,_std::default_delete<argo::json>_>::operator->(object);
  this_02 = json::get_object_abi_cxx11_(this_01);
  this_03 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<argo::json,_std::default_delete<argo::json>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<argo::json,_std::default_delete<argo::json>_>_>_>_>
            ::operator[](this_02,(key_type *)local_50);
  std::unique_ptr<argo::json,_std::default_delete<argo::json>_>::operator=
            (this_03,(unique_ptr<argo::json,_std::default_delete<argo::json>_> *)local_78);
  std::unique_ptr<argo::json,_std::default_delete<argo::json>_>::~unique_ptr
            ((unique_ptr<argo::json,_std::default_delete<argo::json>_> *)local_78);
  std::__cxx11::string::~string(local_50);
  return;
}

Assistant:

void parser::parse_name_value_pair(lexer &l, unique_ptr<json> &object, size_t nesting_depth)
{
    const token &t1 = l.next();

    string name;

    if (t1.get_type() == token::string_e)
    {
        if (m_convert_strings)
        {
            name = *utf8::json_string_to_utf8(t1.get_raw_value());
        }
        else
        {
            name = t1.get_raw_value();
        }
    }
    else
    {
        throw json_parser_exception(
                        json_parser_exception::unexpected_token_e,
                        t1.get_raw_value(),
                        m_reader.get_byte_index());
    }

    const token &t2 = l.next();

    if (t2.get_type() != token::name_separator_e)
    {
        throw json_parser_exception(
                            json_parser_exception::unexpected_token_e,
                            t2.get_raw_value(),
                            m_reader.get_byte_index());
    }

    object->get_object()[name] = parse_value(l, nesting_depth);
}